

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Attribute.h
# Opt level: O1

void __thiscall adios2::core::Attribute<signed_char>::~Attribute(Attribute<signed_char> *this)

{
  pointer pcVar1;
  pointer pcVar2;
  
  (this->super_AttributeBase)._vptr_AttributeBase = (_func_int **)&PTR__Attribute_0087b380;
  pcVar1 = (this->m_DataArray).super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl
           .super__Vector_impl_data._M_start;
  if (pcVar1 != (pointer)0x0) {
    operator_delete(pcVar1);
  }
  (this->super_AttributeBase)._vptr_AttributeBase = (_func_int **)&PTR__AttributeBase_0087b768;
  pcVar2 = (this->super_AttributeBase).m_Name._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != &(this->super_AttributeBase).m_Name.field_2) {
    operator_delete(pcVar2);
    return;
  }
  return;
}

Assistant:

~Attribute() = default;